

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O1

int mbedtls_camellia_setkey_dec(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  ulong uVar1;
  uint32_t *puVar2;
  int iVar3;
  ulong uVar4;
  uint32_t *puVar5;
  mbedtls_camellia_context cty;
  mbedtls_camellia_context local_134;
  
  memset(&local_134,0,0x114);
  iVar3 = mbedtls_camellia_setkey_enc(&local_134,key,keybits);
  if (iVar3 == 0) {
    ctx->nr = local_134.nr;
    uVar4 = (ulong)((uint)(local_134.nr == 4) * 8);
    uVar1 = (ulong)(local_134.nr == 4);
    ctx->rk[0] = local_134.rk[uVar1 * 0x10 + 0x30];
    ctx->rk[1] = local_134.rk[uVar1 * 0x10 + 0x31];
    ctx->rk[2] = local_134.rk[uVar1 * 0x10 + 0x32];
    ctx->rk[3] = local_134.rk[uVar1 * 0x10 + 0x33];
    puVar2 = ctx->rk + 4;
    do {
      puVar5 = puVar2;
      *puVar5 = local_134.rk[uVar4 * 2 + 0x2e];
      puVar5[1] = local_134.rk[uVar4 * 2 + 0x2f];
      uVar4 = uVar4 - 1;
      puVar2 = puVar5 + 2;
    } while (uVar4 != 0xffffffffffffffea);
    puVar5[2] = local_134.rk[0];
    puVar5[3] = local_134.rk[1];
    puVar5[4] = local_134.rk[2];
    puVar5[5] = local_134.rk[3];
  }
  mbedtls_platform_zeroize(&local_134,0x114);
  return iVar3;
}

Assistant:

int mbedtls_camellia_setkey_dec( mbedtls_camellia_context *ctx,
                                 const unsigned char *key,
                                 unsigned int keybits )
{
    int idx, ret;
    size_t i;
    mbedtls_camellia_context cty;
    uint32_t *RK;
    uint32_t *SK;
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( key != NULL );

    mbedtls_camellia_init( &cty );

    /* Also checks keybits */
    if( ( ret = mbedtls_camellia_setkey_enc( &cty, key, keybits ) ) != 0 )
        goto exit;

    ctx->nr = cty.nr;
    idx = ( ctx->nr == 4 );

    RK = ctx->rk;
    SK = cty.rk + 24 * 2 + 8 * idx * 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

    for( i = 22 + 8 * idx, SK -= 6; i > 0; i--, SK -= 4 )
    {
        *RK++ = *SK++;
        *RK++ = *SK++;
    }

    SK -= 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

exit:
    mbedtls_camellia_free( &cty );

    return( ret );
}